

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslOpMap.cpp
# Opt level: O0

TOperator glslang::HlslOpMap::postUnary(EHlslTokenClass op)

{
  TOperator local_c;
  EHlslTokenClass op_local;
  
  switch(op) {
  case EHTokIncOp:
    local_c = EOpPostIncrement;
    break;
  case EHTokDecOp:
    local_c = EOpPostDecrement;
    break;
  default:
    local_c = EOpNull;
    break;
  case EHTokLeftBracket:
    local_c = EOpIndexIndirect;
    break;
  case EHTokDot:
    local_c = EOpIndexDirectStruct;
    break;
  case EHTokColonColon:
    local_c = EOpScoping;
  }
  return local_c;
}

Assistant:

TOperator HlslOpMap::postUnary(EHlslTokenClass op)
{
    switch (op) {
    case EHTokDot:         return EOpIndexDirectStruct;
    case EHTokLeftBracket: return EOpIndexIndirect;

    case EHTokIncOp:       return EOpPostIncrement;
    case EHTokDecOp:       return EOpPostDecrement;

    case EHTokColonColon:  return EOpScoping;

    default:               return EOpNull;             // means not a post-unary op
    }
}